

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>::
insert<std::basic_string_view<char,std::char_traits<char>>>
          (DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
           *this,string_view searchValue1,GlobalBrokerId *searchValue2,
          basic_string_view<char,_std::char_traits<char>_> *data)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *args;
  mapped_type *pmVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_RDI;
  optional<unsigned_long> oVar4;
  size_type index;
  iterator fnd2;
  iterator fnd;
  unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
  *in_stack_ffffffffffffff68;
  size_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false> local_58;
  _Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false> local_50;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_40 [6];
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff68,(key_type *)0x53f9db);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff68);
  bVar1 = std::__detail::operator==(local_40,&local_48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_50._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type *)0x53fa20);
    local_58._M_cur =
         (__node_type *)
         CLI::std::
         unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = CLI::std::__detail::operator==(&local_50,&local_58);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
      uVar3 = extraout_RDX;
      goto LAB_0053fb06;
    }
  }
  args = (basic_string_view<char,_std::char_traits<char>_> *)
         CLI::std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>::size
                   ((vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_> *)
                    in_RDI);
  std::vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>>
            ((vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_> *)in_RDI,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff78);
  StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>(in_stack_ffffffffffffffa0,args)
  ;
  this_00 = &(in_RDI->_M_h)._M_element_count;
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)(in_RDI + 1) + 0x18));
  std::
  unordered_map<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>>
  ::emplace<std::__cxx11::string&,unsigned_long&>(in_RDI,in_stack_ffffffffffffff78,this_00);
  pmVar2 = CLI::std::
           unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
           ::operator[]((unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
                         *)this_00,(key_type *)in_stack_ffffffffffffff68);
  *pmVar2 = (mapped_type)args;
  std::optional<unsigned_long>::optional<unsigned_long,_true>
            ((optional<unsigned_long> *)this_00,(unsigned_long *)in_stack_ffffffffffffff68);
  uVar3 = extraout_RDX_00;
LAB_0053fb06:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            lookup2[searchValue2] = index;
            return index;
        }